

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

void init_write_index_block(FFSFile f)

{
  int iVar1;
  void *pvVar2;
  long in_RDI;
  off_t end_of_index;
  int data_index_start;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar3;
  
  uVar3 = 0;
  if (*(long *)(in_RDI + 0x90) == 0) {
    iVar1 = (*ffs_file_lseek_func)(*(void **)(in_RDI + 0x20),0x100,1);
    if (*(long *)(in_RDI + 0x88) == 0) {
      pvVar2 = ffs_malloc(CONCAT44(uVar3,in_stack_fffffffffffffff0));
      *(void **)(in_RDI + 0x88) = pvVar2;
      memset(*(void **)(in_RDI + 0x88),0,0x20);
    }
    else {
      uVar3 = *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0xc);
    }
    **(long **)(in_RDI + 0x88) = (long)iVar1 + -0x100;
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 8) = uVar3;
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0xc) = *(undefined4 *)(*(long *)(in_RDI + 0x88) + 8);
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0x10) = 0x100;
    if (*(long *)(*(long *)(in_RDI + 0x88) + 0x18) == 0) {
      pvVar2 = ffs_malloc(CONCAT44(uVar3,in_stack_fffffffffffffff0));
      *(void **)(*(long *)(in_RDI + 0x88) + 0x18) = pvVar2;
      memset(*(void **)(*(long *)(in_RDI + 0x88) + 0x18),0,0x100);
    }
    *(undefined4 *)(*(long *)(in_RDI + 0x88) + 0x14) = 0x10;
    *(long *)(in_RDI + 0x78) = (long)iVar1;
  }
  else {
    *(undefined8 *)(in_RDI + 0x90) = 0;
  }
  return;
}

Assistant:

static void
init_write_index_block(FFSFile f)
{
    int data_index_start = 0;
    off_t end_of_index;
    if (f->read_index == NULL) { /* if not append */
	end_of_index = ffs_file_lseek_func(f->file_id, INDEX_BLOCK_SIZE, SEEK_CUR);
	if (f->cur_index) {
	    data_index_start = f->cur_index->write_info.data_index_end;
	} else {
	    f->cur_index = malloc(sizeof(*(f->cur_index)));
	    memset(f->cur_index, 0, sizeof(*(f->cur_index)));
	}
    
	f->cur_index->write_info.base_file_pos = end_of_index - INDEX_BLOCK_SIZE;
	f->cur_index->write_info.data_index_start = data_index_start;
	f->cur_index->write_info.data_index_end = f->cur_index->write_info.data_index_start;
	f->cur_index->write_info.index_block_size = INDEX_BLOCK_SIZE;
	if (!f->cur_index->write_info.index_block) {
	    f->cur_index->write_info.index_block = malloc(INDEX_BLOCK_SIZE);
	    memset(f->cur_index->write_info.index_block, 0, INDEX_BLOCK_SIZE);
	}
	f->cur_index->write_info.next_item_offset = 16;   /* number of bytes written below */
	f->fpos = end_of_index;
    } else {
	f->read_index = NULL;
    }
}